

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O3

mp_int * provableprime_generate_inner
                   (ProvablePrimeContext *ppc,PrimeCandidateSource *pcs,ProgressReceiver *prog,
                   double progress_origin,double progress_scale)

{
  SubprimePolicy SVar1;
  Pockle *pockle;
  ProgressReceiver *prog_00;
  uint uVar2;
  PockleStatus PVar3;
  uint uVar4;
  mp_int *pmVar5;
  mp_int **ppmVar6;
  mp_int *pmVar7;
  mp_int *x;
  mp_int *pmVar8;
  mp_int *x_00;
  size_t sVar9;
  double *ptr;
  size_t sVar10;
  uint *puVar11;
  PrimeCandidateSource *pcs_00;
  MillerRabin *mr;
  ulong uVar12;
  PrimeCandidateSource *pcs_01;
  mp_int *to_free_1;
  ProvablePrimeContext *ppc_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  mp_int *to_free;
  mp_int *to_free_2;
  size_t sVar16;
  double dVar17;
  size_t nfactors;
  size_t ssize;
  double local_98;
  size_t local_90;
  uint *local_88;
  double local_80;
  ProgressReceiver *local_78;
  ProvablePrimeContext *local_70;
  double local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  PrimeCandidateSource *local_50;
  double local_48;
  double local_40;
  size_t local_38;
  
  local_48 = progress_scale;
  local_40 = progress_origin;
  local_5c = pcs_get_bits(pcs);
  if (local_5c < 2) {
    __assert_fail("bits > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                  ,0x14a,
                  "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                 );
  }
  if (local_5c < 0x21) {
    pockle = ppc->pockle;
    uVar2 = pcs_get_bits(pcs);
    if (0x20 < uVar2) {
      __assert_fail("pcs_get_bits(pcs) <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                    ,0x104,"mp_int *primegen_small(Pockle *, PrimeCandidateSource *)");
    }
    pcs_ready(pcs);
    pmVar5 = pcs_generate(pcs);
    while (pmVar5 != (mp_int *)0x0) {
      PVar3 = pockle_add_small_prime(pockle,pmVar5);
      if (PVar3 == POCKLE_OK) goto LAB_00118eea;
      mp_free(pmVar5);
      pmVar5 = pcs_generate(pcs);
    }
    pmVar5 = (mp_int *)0x0;
LAB_00118eea:
    pcs_free(pcs);
  }
  else {
    local_78 = prog;
    pmVar5 = mp_from_integer(1);
    local_50 = pcs;
    ppmVar6 = pcs_get_known_prime_factors(pcs,&local_90);
    local_70 = ppc;
    if (local_90 != 0) {
      uVar12 = 0;
      pmVar7 = pmVar5;
      do {
        pmVar5 = mp_mul(pmVar7,ppmVar6[uVar12]);
        pmVar5 = mp_unsafe_shrink(pmVar5);
        mp_free(pmVar7);
        uVar12 = uVar12 + 1;
        pmVar7 = pmVar5;
      } while (uVar12 < local_90);
    }
    pcs_01 = local_50;
    pmVar7 = pcs_get_upper_bound(local_50);
    uVar15 = 0;
    x = mp_nthroot(pmVar7,3,(mp_int *)0x0);
    pmVar8 = mp_div(pmVar7,pmVar5);
    pmVar8 = mp_unsafe_shrink(pmVar8);
    mp_free(pmVar7);
    pmVar7 = mp_add(x,pmVar5);
    mp_sub_integer_into(pmVar7,pmVar7,1);
    x_00 = mp_div(pmVar7,pmVar5);
    mp_free(pmVar7);
    pmVar7 = mp_unsafe_shrink(x_00);
    mp_free(x);
    uVar2 = pcs_get_bits_remaining(pcs_01);
    uVar4 = mp_hs_integer(pmVar7,2);
    if (uVar4 != 0) {
      sVar9 = mp_get_nbits(pmVar7);
      uVar15 = (int)sVar9 + 1;
    }
    mp_free(pmVar8);
    mp_free(pmVar7);
    mp_free(pmVar5);
    ppc_00 = local_70;
    if (uVar15 != 0) {
      uVar14 = uVar2 >> 1;
      uVar4 = 0;
      if (0x13 < uVar2) {
        uVar4 = uVar2 - 0x14;
      }
      uVar13 = uVar15;
      if (uVar15 < uVar14) {
        uVar13 = uVar14;
      }
      if (uVar4 <= uVar13) {
        uVar4 = uVar13;
      }
      local_90 = 0;
      SVar1 = local_70->extra->spp;
      if (SVar1 != SPP_FAST) {
        if (SVar1 == SPP_MAURER_COMPLEX) {
          if (uVar14 < uVar4) {
            local_38 = 0;
            local_58 = uVar4 + 1;
            ptr = (double *)0x0;
            local_88 = (uint *)0x0;
            local_54 = uVar13;
LAB_001190ed:
            local_80 = 1.0;
            sVar9 = 0;
LAB_001190f6:
            local_68 = uniform_random_double();
            local_68 = local_68 * local_80;
            local_80 = local_80 - local_68;
            ptr = (double *)safegrowarray(ptr,&local_38,8,sVar9,1,false);
            sVar10 = sVar9;
            if (sVar9 != 0) goto LAB_00119142;
            *ptr = local_68;
            sVar10 = 1;
            goto LAB_0011917b;
          }
        }
        else if (SVar1 != SPP_MAURER_SIMPLE) {
          __assert_fail("false && \"bad subprime policy\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                        ,0x261,
                        "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                       );
        }
        do {
          do {
            dVar17 = uniform_random_double();
            dVar17 = exp2(dVar17 + -1.0);
            uVar15 = (uint)(long)(dVar17 * (double)uVar4 + 0.5);
          } while (uVar15 < uVar13);
        } while (uVar4 < uVar15);
      }
      sVar16 = 1;
      local_88 = (uint *)safegrowarray((void *)0x0,&local_90,4,0,1,false);
      *local_88 = uVar15;
LAB_001192ce:
      prog_00 = local_78;
      local_68 = (double)local_5c;
      local_98 = 0.0;
      sVar9 = 0;
      do {
        local_80 = (double)local_88[sVar9] / local_68;
        pcs_00 = pcs_new(local_88[sVar9]);
        pmVar5 = provableprime_generate_inner
                           (ppc_00,pcs_00,prog_00,local_48 * local_98 + local_40,local_80 * local_48
                           );
        if (pmVar5 == (mp_int *)0x0) {
          __assert_fail("q",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                        ,0x26c,
                        "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                       );
        }
        local_98 = local_98 + local_80;
        pcs_require_residue_1_mod_prime(pcs_01,pmVar5);
        mp_free(pmVar5);
        puVar11 = local_88;
        sVar9 = sVar9 + 1;
      } while (sVar16 != sVar9);
      smemclr(local_88,local_90 << 2);
      safefree(puVar11);
    }
    pcs_ready(pcs_01);
    pmVar5 = pcs_generate(pcs_01);
    if (pmVar5 != (mp_int *)0x0) {
      do {
        mr = miller_rabin_new(pmVar5);
        pmVar7 = miller_rabin_find_potential_primitive_root(mr);
        miller_rabin_free(mr);
        if (pmVar7 != (mp_int *)0x0) {
          ppmVar6 = pcs_get_known_prime_factors(pcs_01,&local_90);
          PVar3 = pockle_add_prime(local_70->pockle,pmVar5,ppmVar6,local_90,pmVar7);
          if (PVar3 == POCKLE_OK) {
            mp_free(pmVar7);
            pcs_free(pcs_01);
            (*local_78->vt->report)(local_78,local_40 + local_48);
            return pmVar5;
          }
          if (2 < PVar3 - POCKLE_DISCRIMINANT_IS_SQUARE) {
            __assert_fail("st == POCKLE_DISCRIMINANT_IS_SQUARE || st == POCKLE_WITNESS_POWER_IS_1 || st == POCKLE_WITNESS_POWER_NOT_COPRIME"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                          ,0x2a2,
                          "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                         );
          }
          mp_free(pmVar5);
          pmVar5 = pmVar7;
        }
        mp_free(pmVar5);
        pmVar5 = pcs_generate(pcs_01);
      } while (pmVar5 != (mp_int *)0x0);
    }
    pcs_free(pcs_01);
    pmVar5 = (mp_int *)0x0;
  }
  return pmVar5;
LAB_00119142:
  do {
    if (local_68 <= ptr[sVar10 - 1]) goto LAB_0011915b;
    ptr[sVar10] = ptr[sVar10 - 1];
    sVar10 = sVar10 - 1;
  } while (sVar10 != 0);
  sVar10 = 0;
LAB_0011915b:
  ptr[sVar10] = local_68;
  sVar10 = sVar9 + 1;
  sVar9 = 0;
  if (sVar10 == 0) goto LAB_001190f6;
LAB_0011917b:
  dVar17 = 0.0;
  sVar16 = 0;
LAB_0011918a:
  dVar17 = dVar17 + ptr[sVar16];
  if (ptr[sVar16] + dVar17 <= 1.0) goto code_r0x0011919f;
  sVar16 = sVar16 + 1;
  sVar9 = 0;
  uVar4 = 0;
  uVar15 = 0;
  puVar11 = local_88;
  do {
    dVar17 = ptr[sVar9];
    puVar11 = (uint *)safegrowarray(puVar11,&local_90,4,sVar9,1,false);
    uVar14 = (uint)(long)(dVar17 * (double)uVar2 + 1.0);
    puVar11[sVar9] = uVar14;
    sVar9 = sVar9 + 1;
    uVar15 = (uVar15 + uVar14) - 1;
    uVar4 = uVar4 + uVar14;
  } while (sVar16 != sVar9);
  local_88 = puVar11;
  if ((local_54 <= uVar15) && (uVar4 <= local_58)) {
    smemclr(ptr,local_38 << 3);
    safefree(ptr);
    pcs_01 = local_50;
    ppc_00 = local_70;
    goto LAB_001192ce;
  }
  goto LAB_001190ed;
code_r0x0011919f:
  sVar16 = sVar16 + 1;
  sVar9 = sVar10;
  if (sVar10 == sVar16) goto LAB_001190f6;
  goto LAB_0011918a;
}

Assistant:

static mp_int *provableprime_generate_inner(
    ProvablePrimeContext *ppc, PrimeCandidateSource *pcs,
    ProgressReceiver *prog, double progress_origin, double progress_scale)
{
    unsigned bits = pcs_get_bits(pcs);
    assert(bits > 1);

    if (bits <= 32) {
        debug_f("ppgi(%u) -> small", bits);
        return primegen_small(ppc->pockle, pcs);
    }

    unsigned min_bits_needed, max_bits_needed;
    {
        /*
         * Find the product of all the prime factors we already know
         * about.
         */
        mp_int *size_got = mp_from_integer(1);
        size_t nfactors;
        mp_int **factors = pcs_get_known_prime_factors(pcs, &nfactors);
        for (size_t i = 0; i < nfactors; i++) {
            mp_int *to_free = size_got;
            size_got = mp_unsafe_shrink(mp_mul(size_got, factors[i]));
            mp_free(to_free);
        }

        /*
         * Find the largest cofactor we might be able to use, and the
         * smallest one we can get away with.
         */
        mp_int *upperbound = pcs_get_upper_bound(pcs);
        mp_int *size_needed = mp_nthroot(upperbound, 3, NULL);
        debug_f_mp("upperbound = ", upperbound);
        {
            mp_int *to_free = upperbound;
            upperbound = mp_unsafe_shrink(mp_div(upperbound, size_got));
            mp_free(to_free);
        }
        debug_f_mp("size_needed = ", size_needed);
        {
            mp_int *to_free = size_needed;
            size_needed = mp_unsafe_shrink(mp_ceil_div(size_needed, size_got));
            mp_free(to_free);
        }

        max_bits_needed = pcs_get_bits_remaining(pcs);

        /*
         * We need a prime that is greater than or equal to
         * 'size_needed' in order for the product of all our known
         * factors of p-1 to exceed the cube root of the largest value
         * p might take.
         *
         * Since pcs_new wants a size specified in bits, we must count
         * the bits in size_needed and then add 1. Otherwise we might
         * get a value with the same bit count as size_needed but
         * slightly smaller than it.
         *
         * An exception is if size_needed = 1. In that case the
         * product of existing known factors is _already_ enough, so
         * we don't need to generate an extra factor at all.
         */
        if (mp_hs_integer(size_needed, 2)) {
            min_bits_needed = mp_get_nbits(size_needed) + 1;
        } else {
            min_bits_needed = 0;
        }

        mp_free(upperbound);
        mp_free(size_needed);
        mp_free(size_got);
    }

    double progress = 0.0;

    if (min_bits_needed) {
        debug_f("ppgi(%u) recursing, need [%u,%u] more bits",
                bits, min_bits_needed, max_bits_needed);

        unsigned *sizes = NULL;
        size_t nsizes = 0, sizesize = 0;

        unsigned real_min = max_bits_needed / 2;
        unsigned real_max = (max_bits_needed >= 20 ?
                             max_bits_needed - 20 : 0);
        if (real_min < min_bits_needed)
            real_min = min_bits_needed;
        if (real_max < real_min)
            real_max = real_min;
        debug_f("ppgi(%u) revised bits interval = [%u,%u]",
                bits, real_min, real_max);

        switch (ppc->extra->spp) {
          case SPP_FAST:
            /*
             * Always pick the smallest subsidiary prime we can get
             * away with: just over n/3 bits.
             *
             * This is not a good mode for cryptographic prime
             * generation, because it skews the distribution of primes
             * greatly, and worse, it skews them in a direction that
             * heads away from the properties crypto algorithms tend
             * to like.
             *
             * (For both discrete-log systems and RSA, people have
             * tended to recommend in the past that p-1 should have a
             * _large_ factor if possible. There's some disagreement
             * on which algorithms this is really necessary for, but
             * certainly I've never seen anyone recommend arranging a
             * _small_ factor on purpose.)
             *
             * I originally implemented this mode because it was
             * convenient for debugging - it wastes as little time as
             * possible on finding a sub-prime and lets you get to the
             * interesting part! And I leave it in the code because it
             * might still be useful for _something_. Because it's
             * cryptographically questionable, it's not selectable in
             * the UI of either version of PuTTYgen proper; but it can
             * be accessed through testcrypt, and if for some reason a
             * definite prime is needed for non-crypto purposes, it
             * may still be the fastest way to put your hands on one.
             */
            debug_f("ppgi(%u) fast mode, just ask for %u bits",
                    bits, min_bits_needed);
            sgrowarray(sizes, sizesize, nsizes);
            sizes[nsizes++] = min_bits_needed;
            break;
          case SPP_MAURER_SIMPLE: {
            /*
             * Select the size of the subsidiary prime at random from
             * sqrt(outputprime) up to outputprime/2^20, in such a way
             * that the probability distribution matches that of the
             * largest prime factor of a random n-bit number.
             *
             * Per [MAURER] section 3.4, the cumulative distribution
             * function of this relative size is 1+log2(x), for x in
             * [1/2,1]. You can generate a value from the distribution
             * given by a cdf by applying the inverse cdf to a uniform
             * value in [0,1]. Simplifying that in this case, what we
             * have to do is raise 2 to the power of a random real
             * number between -1 and 0. (And that gives you the number
             * of _bits_ in the sub-prime, as a factor of the desired
             * output number of bits.)
             *
             * We also require that the subsidiary prime q is at least
             * 20 bits smaller than the output one, to give us a
             * fighting chance of there being _any_ prime we can find
             * such that q | p-1.
             *
             * (But these rules have to be applied in an order that
             * still leaves us _some_ interval of possible sizes we
             * can pick!)
             */
          maurer_simple:
            debug_f("ppgi(%u) Maurer simple mode", bits);

            unsigned sub_bits;
            do {
                double uniform = uniform_random_double();
                sub_bits = real_max * pow(2.0, uniform - 1) + 0.5;
                debug_f(" ... %.6f -> %u?", uniform, sub_bits);
            } while (!(real_min <= sub_bits && sub_bits <= real_max));

            debug_f("ppgi(%u) asking for %u bits", bits, sub_bits);
            sgrowarray(sizes, sizesize, nsizes);
            sizes[nsizes++] = sub_bits;

            break;
          }
          case SPP_MAURER_COMPLEX: {
            /*
             * In this mode, we may generate multiple factors of p-1
             * which between them add up to at least n/2 bits, in such
             * a way that those are guaranteed to be the largest
             * factors of p-1 and that they have the same probability
             * distribution as the largest k factors would have in a
             * random integer. The idea is that this more elaborate
             * procedure gets as close as possible to the same
             * probability distribution you'd get by selecting a
             * completely random prime (if you feasibly could).
             *
             * Algorithm from Appendix 1 of [MAURER]: we generate
             * random real numbers that sum to at most 1, by choosing
             * each one uniformly from the range [0, 1 - sum of all
             * the previous ones]. We maintain them in a list in
             * decreasing order, and we stop as soon as we find an
             * initial subsequence of the list s_1,...,s_r such that
             * s_1 + ... + s_{r-1} + 2 s_r > 1. In particular, this
             * guarantees that the sum of that initial subsequence is
             * at least 1/2, so we end up with enough factors to
             * satisfy Pocklington.
             */

            if (max_bits_needed / 2 + 1 > real_max) {
                /* Early exit path in the case where this algorithm
                 * can't possibly generate a value in the range we
                 * need. In that situation, fall back to Maurer
                 * simple. */
                debug_f("ppgi(%u) skipping GenerateSizeList, "
                        "real_max too small", bits);
                goto maurer_simple;    /* sorry! */
            }

            double *s = NULL;
            size_t ns, ssize = 0;

            while (true) {
                debug_f("ppgi(%u) starting GenerateSizeList", bits);
                ns = 0;
                double range = 1.0;
                while (true) {
                    /* Generate the next number */
                    double u = uniform_random_double() * range;
                    range -= u;
                    debug_f("  u_%"SIZEu" = %g", ns, u);

                    /* Insert it in the list */
                    sgrowarray(s, ssize, ns);
                    size_t i;
                    for (i = ns; i > 0 && s[i-1] < u; i--)
                        s[i] = s[i-1];
                    s[i] = u;
                    ns++;
                    debug_f("    inserting as s[%"SIZEu"]", i);

                    /* Look for a suitable initial subsequence */
                    double sum = 0;
                    for (i = 0; i < ns; i++) {
                        sum += s[i];
                        if (sum + s[i] > 1.0) {
                            debug_f("  s[0..%"SIZEu"] works!", i);

                            /* Truncate the sequence here, and stop
                             * generating random real numbers. */
                            ns = i+1;
                            goto got_list;
                        }
                    }
                }

              got_list:;
                /*
                 * Now translate those real numbers into actual bit
                 * counts, and do a last-minute check to make sure
                 * their product is going to be in range.
                 *
                 * We have to check both the min and max sizes of the
                 * total. A b-bit number is in [2^{b-1},2^b). So the
                 * product of numbers of sizes b_1,...,b_k is at least
                 * 2^{\sum (b_i-1)}, and less than 2^{\sum b_i}.
                 */
                nsizes = 0;

                unsigned min_total = 0, max_total = 0;

                for (size_t i = 0; i < ns; i++) {
                    /* These sizes are measured in actual entropy, so
                     * add 1 bit each time to account for the
                     * zero-information leading 1 */
                    unsigned this_size = max_bits_needed * s[i] + 1;
                    debug_f("  bits[%"SIZEu"] = %u", i, this_size);
                    sgrowarray(sizes, sizesize, nsizes);
                    sizes[nsizes++] = this_size;

                    min_total += this_size - 1;
                    max_total += this_size;
                }

                debug_f("  total bits = [%u,%u)", min_total, max_total);
                if (min_total < real_min || max_total > real_max+1) {
                    debug_f("  total out of range, try again");
                } else {
                    debug_f("  success! %"SIZEu" sub-primes totalling [%u,%u) "
                            "bits", nsizes, min_total, max_total);
                    break;
                }
            }

            smemclr(s, ssize * sizeof(*s));
            sfree(s);
            break;
          }
          default:
            unreachable("bad subprime policy");
        }

        for (size_t i = 0; i < nsizes; i++) {
            unsigned sub_bits = sizes[i];
            double progress_in_this_prime = (double)sub_bits / bits;
            mp_int *q = provableprime_generate_inner(
                ppc, pcs_new(sub_bits),
                prog, progress_origin + progress_scale * progress,
                progress_scale * progress_in_this_prime);
            progress += progress_in_this_prime;
            assert(q);
            debug_f_mp("ppgi(%u) got factor ", q, bits);
            pcs_require_residue_1_mod_prime(pcs, q);
            mp_free(q);
        }

        smemclr(sizes, sizesize * sizeof(*sizes));
        sfree(sizes);
    } else {
        debug_f("ppgi(%u) no need to recurse", bits);
    }

    debug_f("ppgi(%u) ready, %u bits remaining",
            bits, pcs_get_bits_remaining(pcs));
    pcs_ready(pcs);

    while (true) {
        mp_int *p = pcs_generate(pcs);
        if (!p) {
            pcs_free(pcs);
            return NULL;
        }

        debug_f_mp("provable_step p=", p);

        MillerRabin *mr = miller_rabin_new(p);
        debug_f("provable_step mr setup done");
        mp_int *witness = miller_rabin_find_potential_primitive_root(mr);
        miller_rabin_free(mr);

        if (!witness) {
            debug_f("provable_step mr failed");
            mp_free(p);
            continue;
        }

        size_t nfactors;
        mp_int **factors = pcs_get_known_prime_factors(pcs, &nfactors);
        PockleStatus st = pockle_add_prime(
            ppc->pockle, p, factors, nfactors, witness);

        if (st != POCKLE_OK) {
            debug_f("provable_step proof failed %d", (int)st);

            /*
             * Check by assertion that the error status is not one of
             * the ones we ought to have ruled out already by
             * construction. If there's a bug in this code that means
             * we can _never_ pass this test (e.g. picking products of
             * factors that never quite reach cbrt(n)), we'd rather
             * fail an assertion than loop forever.
             */
            assert(st == POCKLE_DISCRIMINANT_IS_SQUARE ||
                   st == POCKLE_WITNESS_POWER_IS_1 ||
                   st == POCKLE_WITNESS_POWER_NOT_COPRIME);

            mp_free(p);
            if (witness)
                mp_free(witness);
            continue;
        }

        mp_free(witness);
        pcs_free(pcs);
        debug_f_mp("ppgi(%u) done, got ", p, bits);
        progress_report(prog, progress_origin + progress_scale);
        return p;
    }
}